

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O0

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,Def *def)

{
  int iVar1;
  Type *pTVar2;
  ostream *poVar3;
  CompoundStatement *pCVar4;
  Class *pCVar5;
  bool bVar6;
  undefined1 local_68 [48];
  undefined1 local_38 [40];
  Def *def_local;
  CppPrinter *this_local;
  
  local_38._32_8_ = def;
  def_local = (Def *)this;
  print_indentation(this);
  pTVar2 = Def::getReturnType((Def *)local_38._32_8_);
  (**(pTVar2->super_ASTNode)._vptr_ASTNode)(pTVar2,this);
  poVar3 = std::operator<<((ostream *)&this->field_0x20," ");
  Def::getUniqueCppName_abi_cxx11_((Def *)local_38);
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  std::operator<<(poVar3,"(");
  std::__cxx11::string::~string((string *)local_38);
  generateDefParameters(this,(Def *)local_38._32_8_);
  std::operator<<((ostream *)&this->field_0x20,") {\n");
  indent(this);
  generateDefLocalVariables(this,(Def *)local_38._32_8_);
  this->tmpCounter = 0;
  pCVar4 = Def::getStatements((Def *)local_38._32_8_);
  (**(pCVar4->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar4,this);
  dedent(this);
  print_indentation(this);
  std::operator<<((ostream *)&this->field_0x20,"}\n\n");
  Def::getName_abi_cxx11_((Def *)local_68);
  iVar1 = std::__cxx11::string::compare(local_68);
  bVar6 = false;
  if (iVar1 == 0) {
    pCVar5 = Def::getClass((Def *)local_38._32_8_);
    bVar6 = pCVar5 == (Class *)0x0;
  }
  std::__cxx11::string::~string((string *)local_68);
  if (bVar6) {
    this->mainDef = (Def *)local_38._32_8_;
  }
  return;
}

Assistant:

void CppPrinter::visit(Def* def) {
    print_indentation();
    def->getReturnType()->accept(this);
    output << " " << def->getUniqueCppName() << "(";

    generateDefParameters(def);
    output << ") {\n";

    indent();

    generateDefLocalVariables(def);

    tmpCounter = 0;
    def->getStatements()->accept(this);
    dedent();
    print_indentation();
    output << "}\n\n";

    if (def->getName().compare("main") == 0 && def->getClass() == nullptr) {
        mainDef = def;
    }
}